

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_NtkDfsReverse_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *Entry;
  long lVar3;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0xbf,"void Abc_NtkDfsReverse_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar2 - 5 < 0xfffffffe) {
      if (uVar2 == 7) {
        Entry = Abc_ObjFanout0Ntk(pNode);
        for (lVar3 = 0; lVar3 < (Entry->vFanouts).nSize; lVar3 = lVar3 + 1) {
          Abc_NtkDfsReverse_rec
                    ((Abc_Obj_t *)Entry->pNtk->vObjs->pArray[(Entry->vFanouts).pArray[lVar3]],vNodes
                    );
        }
        Vec_PtrPush(vNodes,Entry);
        return;
      }
      __assert_fail("Abc_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,200,"void Abc_NtkDfsReverse_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsReverse_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    pNode = Abc_ObjFanout0Ntk(pNode);
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_NtkDfsReverse_rec( pFanout, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}